

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::SuperClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  bool bVar1;
  Options *extraout_RDX;
  Options *extraout_RDX_00;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string simple_base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  bVar1 = HasDescriptorMethods(*(FileDescriptor **)(this + 0x10),(Options *)descriptor);
  if (bVar1) {
    SimpleBaseClass_abi_cxx11_(&local_60,this,descriptor,options);
    if (local_60._M_string_length == 0) {
      ProtobufNamespace_abi_cxx11_(&local_80,(cpp *)descriptor,extraout_RDX_00);
      std::operator+(&local_a0,"::",&local_80);
      std::operator+(__return_storage_ptr__,&local_a0,"::Message");
      std::__cxx11::string::~string((string *)&local_a0);
      this_00 = &local_80;
    }
    else {
      ProtobufNamespace_abi_cxx11_(&local_40,(cpp *)descriptor,extraout_RDX_00);
      std::operator+(&local_80,"::",&local_40);
      std::operator+(&local_a0,&local_80,"::internal::");
      std::operator+(__return_storage_ptr__,&local_a0,&local_60);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      this_00 = &local_40;
    }
    std::__cxx11::string::~string((string *)this_00);
    this_01 = &local_60;
  }
  else {
    ProtobufNamespace_abi_cxx11_(&local_a0,(cpp *)descriptor,extraout_RDX);
    std::operator+(&local_60,"::",&local_a0);
    std::operator+(__return_storage_ptr__,&local_60,"::MessageLite");
    std::__cxx11::string::~string((string *)&local_60);
    this_01 = &local_a0;
  }
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string SuperClassName(const Descriptor* descriptor,
                           const Options& options) {
  if (!HasDescriptorMethods(descriptor->file(), options)) {
    return "::" + ProtobufNamespace(options) + "::MessageLite";
  }
  auto simple_base = SimpleBaseClass(descriptor, options);
  if (simple_base.empty()) {
    return "::" + ProtobufNamespace(options) + "::Message";
  }
  return "::" + ProtobufNamespace(options) + "::internal::" + simple_base;
}